

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall
MacProj::mlmg_mac_solve
          (MacProj *this,Amr *a_parent,MultiFab *cphi,BCRec *a_phys_bc,BCRec *density_math_bc,
          int level,Real a_mac_tol,Real a_mac_abs_tol,Real rhs_scale,MultiFab *rho,MultiFab *Rhs,
          Array<MultiFab_*,_3> *u_mac,MultiFab *mac_phi,Array<MultiFab_*,_3> *fluxes)

{
  initializer_list<amrex::BCRec> iVar1;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> iVar2;
  initializer_list<std::array<const_amrex::MultiFab_*,_3UL>_> iVar3;
  initializer_list<amrex::Geometry> iVar4;
  initializer_list<const_amrex::MultiFab_*> iVar5;
  initializer_list<amrex::MultiFab_*> iVar6;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> iVar7;
  initializer_list<amrex::MultiFab_*> iVar8;
  MLLinOp *this_00;
  MLMG *this_01;
  reference ppMVar9;
  long in_RDX;
  undefined8 *in_R8;
  Location in_R9D;
  pointer in_XMM2_Qa;
  ParmParse *in_stack_00000008;
  FabArrayBase *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000028;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  MacProjector macproj;
  ParmParse pp;
  int max_coarsening_level;
  LPInfo info;
  int idim_1;
  Real scale_factor;
  int ng_for_invert;
  BoxArray nba;
  int idim;
  Array<std::unique_ptr<MultiFab>,_3> bcoefs;
  DistributionMapping *dm;
  BoxArray *ba;
  Geometry *geom;
  allocator_type *in_stack_fffffffffffff878;
  allocator_type *numerator;
  allocator_type *crse;
  Amr *in_stack_fffffffffffff880;
  MacProjector *this_02;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  BCRec *a_phys_bc_00;
  undefined4 in_stack_fffffffffffff890;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff894;
  BoxArray *in_stack_fffffffffffff898;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *mlmg_lobc_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff8a0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff8a8;
  Geometry *in_stack_fffffffffffff8b0;
  MacProjector *this_03;
  BoxArray *in_stack_fffffffffffff8b8;
  Location a_loc;
  MultiFab *in_stack_fffffffffffff8c0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *a_flux;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff8d0;
  MacProjector *this_04;
  undefined8 in_stack_fffffffffffff8f8;
  int iVar11;
  allocator *ptr;
  pointer in_stack_fffffffffffff908;
  Geometry *a_beta;
  undefined1 *puVar12;
  Location a_umac_loc;
  pointer in_stack_fffffffffffff928;
  MacProjector *in_stack_fffffffffffff930;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_fffffffffffff960;
  LPInfo *in_stack_fffffffffffff968;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_fffffffffffff970;
  Location in_stack_fffffffffffff978;
  Vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>
  *in_stack_fffffffffffff980;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 *local_650;
  undefined8 local_648;
  undefined1 local_621 [57];
  int local_5e8;
  undefined8 local_5e0;
  int local_5d8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_5b8;
  undefined1 local_591 [25];
  BCRec local_578;
  undefined1 local_558 [248];
  undefined1 local_460 [24];
  undefined1 *local_448;
  undefined8 local_440;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 *local_400;
  undefined8 local_3f8;
  MacProjector local_3d8;
  allocator local_2a9;
  string local_2a8 [124];
  int local_22c;
  undefined1 local_228 [40];
  int local_200;
  pointer local_1f8;
  int local_1f0;
  int local_1ec;
  pointer local_1e8;
  undefined4 local_1e0;
  undefined1 local_1d9;
  array<amrex::MultiFab_*,_3UL> local_1d8;
  array<amrex::MultiFab_*,_3UL> *local_1c0;
  pointer local_1b8;
  allocator_type local_1b0 [55];
  undefined1 local_179;
  undefined1 local_178 [248];
  Geometry *local_80;
  pointer local_78;
  Location local_5c;
  undefined8 *local_58;
  long local_48;
  pointer local_30;
  int local_28;
  int local_1c;
  pointer local_18;
  int local_10;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_78 = in_XMM2_Qa;
  local_5c = in_R9D;
  local_58 = in_R8;
  local_48 = in_RDX;
  local_80 = amrex::AmrMesh::Geom
                       ((AmrMesh *)in_stack_fffffffffffff880,
                        (int)((ulong)in_stack_fffffffffffff878 >> 0x20));
  local_178._240_8_ = amrex::FabArrayBase::boxArray(in_stack_00000010);
  local_178._232_8_ = amrex::FabArrayBase::DistributionMap(in_stack_00000010);
  std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::array
            ((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *)
             CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  for (local_178._204_4_ = 0; (int)local_178._204_4_ < 3; local_178._204_4_ = local_178._204_4_ + 1)
  {
    local_1c = local_178._204_4_;
    if (local_178._204_4_ == 0) {
      amrex::IntVect::IntVect((IntVect *)&local_18,1,0,0);
    }
    else if (local_178._204_4_ == 1) {
      amrex::IntVect::IntVect((IntVect *)&local_18,0,1,0);
    }
    else {
      amrex::IntVect::IntVect((IntVect *)&local_18,0,0,1);
    }
    local_28 = local_10;
    local_30 = local_18;
    local_178._72_4_ = local_10;
    local_178._64_8_ = local_18;
    local_178._88_4_ = local_10;
    local_178._80_8_ = local_18;
    amrex::convert(in_stack_fffffffffffff898,
                   (IntVect *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
    operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                *)in_stack_fffffffffffff880,(size_type)in_stack_fffffffffffff878);
    iVar11 = (int)((ulong)in_stack_fffffffffffff878 >> 0x20);
    operator_new(0x180);
    local_179 = 1;
    local_178._16_8_ =
         (__uniq_ptr_impl<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>_>)0x0;
    local_178._24_8_ = (pointer)0x0;
    local_178._0_8_ = (__uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>)0x0
    ;
    local_178._8_8_ =
         (__uniq_ptr_impl<amrex::MLABecLaplacian,_std::default_delete<amrex::MLABecLaplacian>_>)0x0;
    local_178._32_8_ = (pointer)0x0;
    in_stack_fffffffffffff930 = (MacProjector *)local_178;
    in_stack_fffffffffffff928 = (pointer)local_178._232_8_;
    amrex::MFInfo::MFInfo((MFInfo *)0x847a96);
    amrex::Amr::getLevel(in_stack_fffffffffffff880,iVar11);
    in_stack_fffffffffffff878 =
         (allocator_type *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff880);
    amrex::MultiFab::MultiFab
              (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
               (DistributionMapping *)in_stack_fffffffffffff8b0,
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
               (MFInfo *)in_stack_fffffffffffff8a0,
               (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff8d0);
    local_179 = 0;
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff880,(pointer)in_stack_fffffffffffff878);
    amrex::MFInfo::~MFInfo((MFInfo *)0x847b14);
    amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff880);
  }
  amrex::GetArrOfPtrs<amrex::MultiFab>
            ((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *)
             in_stack_fffffffffffff880);
  local_1d8._M_elems[2] = (MultiFab *)local_58[2];
  local_1d8._M_elems[0] = (MultiFab *)*local_58;
  local_1d8._M_elems[1] =
       *(MultiFab **)
        &((__uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)(local_58 + 1))->_M_t;
  local_1c0 = &local_1d8;
  local_1b8 = (pointer)0x1;
  puVar12 = &local_1d9;
  a_beta = local_80;
  std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0x847c3e);
  iVar1._M_array._4_4_ = in_stack_fffffffffffff88c;
  iVar1._M_array._0_4_ = in_stack_fffffffffffff888;
  iVar1._M_len._0_4_ = in_stack_fffffffffffff890;
  iVar1._M_len._4_4_ = in_stack_fffffffffffff894;
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff880,iVar1,
             in_stack_fffffffffffff878);
  numerator = local_1b0;
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            (in_stack_fffffffffffff8c0,(Array<MultiFab_*,_3> *)in_stack_fffffffffffff8b8,
             (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20),(int)in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(Geometry *)in_stack_fffffffffffff8a0,
             in_stack_fffffffffffff8d0);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x847ca9);
  std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0x847cb6);
  local_1e0 = 0;
  local_1e8 = (pointer)(1.0 / (double)local_78);
  local_1ec = 0;
  while( true ) {
    a_loc = (Location)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
    a_umac_loc = (Location)((ulong)puVar12 >> 0x20);
    iVar11 = (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
    if (2 < local_1ec) break;
    std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
    operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                *)in_stack_fffffffffffff880,(size_type)numerator);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x847d11);
    amrex::MultiFab::invert((MultiFab *)in_stack_fffffffffffff880,(Real)numerator,0);
    std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
    operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                *)in_stack_fffffffffffff880,(size_type)numerator);
    in_stack_fffffffffffff908 =
         std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                   ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x847d48);
    join_0x00000010_0x00000000_ = amrex::Geometry::periodicity(in_stack_fffffffffffff8b0);
    local_1f0 = local_200;
    local_1f8 = (pointer)local_228._32_8_;
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_fffffffffffff8a0,(Periodicity *)in_stack_fffffffffffff898,
               SUB41((uint)in_stack_fffffffffffff894 >> 0x18,0));
    local_1ec = local_1ec + 1;
  }
  amrex::LPInfo::LPInfo((LPInfo *)local_228);
  local_22c = 100;
  ptr = &local_2a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"mac_proj",ptr);
  amrex::ParmParse::ParmParse
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
             (string *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  amrex::ParmParse::query(in_stack_00000008,(char *)in_stack_fffffffffffff908,(int *)ptr,iVar11);
  amrex::LPInfo::setMaxCoarseningLevel((LPInfo *)local_228,local_22c);
  amrex::LPInfo::setAgglomeration((LPInfo *)local_228,agglomeration != 0);
  amrex::LPInfo::setConsolidation((LPInfo *)local_228,consolidation != 0);
  local_408 = in_stack_00000018[2];
  local_418 = *in_stack_00000018;
  uStack_410 = in_stack_00000018[1];
  local_400 = &local_418;
  local_3f8 = 1;
  std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::allocator
            ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x847f39);
  iVar2._M_array._4_4_ = in_stack_fffffffffffff88c;
  iVar2._M_array._0_4_ = in_stack_fffffffffffff888;
  iVar2._M_len._0_4_ = in_stack_fffffffffffff890;
  iVar2._M_len._4_4_ = in_stack_fffffffffffff894;
  amrex::
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *)in_stack_fffffffffffff880,iVar2,numerator);
  amrex::GetArrOfConstPtrs<amrex::MultiFab>
            ((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *)
             in_stack_fffffffffffff880);
  local_440._0_4_ = FaceCentroid;
  local_440._4_4_ = FaceCenter;
  local_448 = local_460;
  std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>::allocator
            ((allocator<std::array<const_amrex::MultiFab_*,_3UL>_> *)0x847fa5);
  iVar3._M_array._4_4_ = in_stack_fffffffffffff88c;
  iVar3._M_array._0_4_ = in_stack_fffffffffffff888;
  iVar3._M_len._0_4_ = in_stack_fffffffffffff890;
  iVar3._M_len._4_4_ = in_stack_fffffffffffff894;
  amrex::
  Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
  ::vector((Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
            *)in_stack_fffffffffffff880,iVar3,(allocator_type *)numerator);
  this_04 = (MacProjector *)local_558;
  memcpy(this_04,local_80,200);
  local_558._208_8_ = (pointer)0x1;
  local_558._200_8_ = this_04;
  std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x848013);
  iVar4._M_array._4_4_ = in_stack_fffffffffffff88c;
  iVar4._M_array._0_4_ = in_stack_fffffffffffff888;
  iVar4._M_len._0_4_ = in_stack_fffffffffffff890;
  iVar4._M_len._4_4_ = in_stack_fffffffffffff894;
  amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_stack_fffffffffffff880,
             iVar4,(allocator_type *)numerator);
  local_591._9_8_ = local_591 + 1;
  local_591._17_8_ = 1;
  a_flux = (Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
            *)local_591;
  std::allocator<const_amrex::MultiFab_*>::allocator((allocator<const_amrex::MultiFab_*> *)0x848075)
  ;
  iVar5._M_array._4_4_ = in_stack_fffffffffffff88c;
  iVar5._M_array._0_4_ = in_stack_fffffffffffff888;
  iVar5._M_len._0_4_ = in_stack_fffffffffffff890;
  iVar5._M_len._4_4_ = in_stack_fffffffffffff894;
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff880,iVar5,(allocator_type *)numerator);
  local_5b8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5b8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mlmg_lobc_00 = &local_5b8;
  amrex::Vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>::Vector
            ((Vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_> *)0x8480c2
            );
  a_phys_bc_00 = &local_578;
  this_02 = (MacProjector *)local_228;
  crse = (allocator_type *)(local_558 + 0xd8);
  uVar10 = 3;
  a_sol = mlmg_lobc_00;
  Hydro::MacProjector::MacProjector
            (in_stack_fffffffffffff930,
             (Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
              *)in_stack_fffffffffffff928,a_umac_loc,
             (Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
              *)a_beta,(Location)((ulong)in_stack_00000008 >> 0x20),(Location)in_stack_00000008,
             in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff970,
             in_stack_fffffffffffff978,in_stack_fffffffffffff980);
  amrex::Vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>::~Vector
            ((Vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_> *)0x848133
            );
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x848140);
  std::allocator<const_amrex::MultiFab_*>::~allocator
            ((allocator<const_amrex::MultiFab_*> *)0x84814d);
  amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x84815a);
  std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x848167);
  amrex::
  Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
  ::~Vector((Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
             *)0x848174);
  std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>::~allocator
            ((allocator<std::array<const_amrex::MultiFab_*,_3UL>_> *)0x848181);
  amrex::
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  ~Vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
           *)0x84818e);
  std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::~allocator
            ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x84819b);
  set_mac_solve_bc((MacProj *)in_stack_fffffffffffff8a0,(Array<MLLinOp::BCType,_3> *)mlmg_lobc_00,
                   (Array<MLLinOp::BCType,_3> *)CONCAT44(in_stack_fffffffffffff894,uVar10),
                   a_phys_bc_00,(Geometry *)this_02);
  Hydro::MacProjector::setDomainBC
            ((MacProjector *)CONCAT44(in_stack_fffffffffffff894,uVar10),
             (Array<LinOpBCType,_3> *)a_phys_bc_00,(Array<LinOpBCType,_3> *)this_02);
  if ((0 < (int)local_5c) && (local_48 != 0)) {
    join_0x00000010_0x00000000_ =
         amrex::AmrMesh::refRatio
                   ((AmrMesh *)CONCAT44(in_stack_fffffffffffff894,uVar10),
                    (int)((ulong)a_phys_bc_00 >> 0x20));
    a_loc = (Location)((ulong)local_48 >> 0x20);
    local_5d8 = local_5e8;
    local_5e0 = local_621._49_8_;
    local_8 = &local_5e0;
    local_c = 0;
    Hydro::MacProjector::setCoarseFineBC(this_02,(MultiFab *)crse,0);
  }
  Hydro::MacProjector::setLevelBC
            ((MacProjector *)CONCAT44(in_stack_fffffffffffff894,uVar10),
             (int)((ulong)a_phys_bc_00 >> 0x20),(MultiFab *)this_02);
  this_00 = Hydro::MacProjector::getLinOp(&local_3d8);
  amrex::MLLinOp::setMaxOrder(this_00,max_order);
  if (-1 < max_fmg_iter) {
    this_01 = Hydro::MacProjector::getMLMG(this_02);
    amrex::MLMG::setMaxFmgIter(this_01,max_fmg_iter);
  }
  local_621._9_8_ = local_621 + 1;
  local_621._17_8_ = 1;
  this_03 = (MacProjector *)local_621;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x84849a);
  iVar6._M_len._0_4_ = uVar10;
  iVar6._M_array = (iterator)a_phys_bc_00;
  iVar6._M_len._4_4_ = in_stack_fffffffffffff894;
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)this_02,iVar6,crse);
  Hydro::MacProjector::project
            (this_03,in_stack_fffffffffffff8a8,(Real)in_stack_fffffffffffff8a0,(Real)mlmg_lobc_00);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x8484f4);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x848501);
  ppMVar9 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                      ((array<amrex::MultiFab_*,_3UL> *)this_02,(size_type)crse);
  if (*ppMVar9 != (value_type)0x0) {
    local_658 = in_stack_00000028[2];
    local_668 = *in_stack_00000028;
    uStack_660 = in_stack_00000028[1];
    local_650 = &local_668;
    local_648 = 1;
    std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::allocator
              ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x848569);
    iVar7._M_len._0_4_ = uVar10;
    iVar7._M_array = (iterator)a_phys_bc_00;
    iVar7._M_len._4_4_ = in_stack_fffffffffffff894;
    amrex::
    Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
    ::vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
              *)this_02,iVar7,(allocator_type *)crse);
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x8485cb);
    iVar8._M_len._0_4_ = uVar10;
    iVar8._M_array = (iterator)a_phys_bc_00;
    iVar8._M_len._4_4_ = in_stack_fffffffffffff894;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)this_02,iVar8,crse);
    Hydro::MacProjector::getFluxes(this_04,a_flux,a_sol,a_loc);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x848620);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x84862d);
    amrex::
    Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
    ::~Vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               *)0x84863a);
    std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::~allocator
              ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x848647);
  }
  Hydro::MacProjector::~MacProjector(this_02);
  amrex::ParmParse::~ParmParse((ParmParse *)0x848725);
  std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::~array
            ((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *)
             CONCAT44(in_stack_fffffffffffff894,uVar10));
  return;
}

Assistant:

void
MacProj::mlmg_mac_solve (Amr* a_parent, const MultiFab* cphi, const BCRec& a_phys_bc,
			 const BCRec& density_math_bc,
			 int level, Real a_mac_tol, Real a_mac_abs_tol, Real rhs_scale,
			 const MultiFab &rho, const MultiFab &Rhs,
			 Array<MultiFab*,AMREX_SPACEDIM>& u_mac, MultiFab *mac_phi,
			 Array<MultiFab*,AMREX_SPACEDIM>& fluxes)
{
    const Geometry& geom = a_parent->Geom(level);
    const BoxArray& ba = Rhs.boxArray();
    const DistributionMapping& dm = Rhs.DistributionMap();

    //
    // Compute beta coefficients
    //
    Array<std::unique_ptr<MultiFab>,AMREX_SPACEDIM> bcoefs;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        BoxArray nba = amrex::convert(ba,IntVect::TheDimensionVector(idim));
        bcoefs[idim].reset(new  MultiFab(nba, dm, 1, 0, MFInfo(),
					 (a_parent->getLevel(level)).Factory()));
    }

    //
    // Set bcoefs to the average of Density at the faces
    // In the EB case, they will be defined at the Face Centroid
    //
#ifdef AMREX_USE_EB
    EB_interp_CellCentroid_to_FaceCentroid( rho, GetArrOfPtrs(bcoefs), 0, 0, 1,
					    geom, {density_math_bc});
#else
    amrex::ignore_unused(density_math_bc);
    average_cellcenter_to_face(GetArrOfPtrs(bcoefs), rho, geom);
#endif

    //
    // Now invert the coefficients and apply scale factor
    //
    int ng_for_invert(0);
    Real scale_factor(1.0/rhs_scale);

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        bcoefs[idim]->invert(scale_factor,ng_for_invert);
        bcoefs[idim]->FillBoundary( geom.periodicity() );
    }

    //
    // Create MacProjector Object
    //
    LPInfo info;
    int max_coarsening_level(100);
    ParmParse pp("mac_proj");
    pp.query("mg_max_coarsening_level", max_coarsening_level);

    info.setMaxCoarseningLevel(max_coarsening_level);
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);

    //
    // To use phi on CellCentroids, must also call
    // macproj.get_linop().setEBDirichlet (int amrlev, const MultiFab& phi, const MultiFab& beta)
    // or
    // macproj.get_linop().setEBHomogDirichlet (int amrlev, const MultiFab& beta)
    //
    // Location information is not used for non-EB
    //
    Hydro::MacProjector macproj( {u_mac}, MLMG::Location::FaceCentroid, // Location of umac (face center vs centroid)
                                {GetArrOfConstPtrs(bcoefs)}, MLMG::Location::FaceCentroid,  // Location of beta (face center vs centroid)
                                MLMG::Location::CellCenter,           // Location of solution variable phi (cell center vs centroid)
                                {geom}, info,
                                {&Rhs}, MLMG::Location::CellCentroid);  // Location of RHS (cell center vs centroid)

    //
    // Set BCs
    //
    std::array<MLLinOp::BCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<MLLinOp::BCType,AMREX_SPACEDIM> mlmg_hibc;
    set_mac_solve_bc(mlmg_lobc, mlmg_hibc, a_phys_bc, geom);

    macproj.setDomainBC(mlmg_lobc, mlmg_hibc);
    if (level > 0 && cphi)
    {
        macproj.setCoarseFineBC(cphi, a_parent->refRatio(level-1)[0]);
    }
    macproj.setLevelBC(0, mac_phi);

    // MacProj default max order is 3. Here we use a default of 4, so must
    // call setMaxOrder to overwrite MacProj default.
    macproj.getLinOp().setMaxOrder(max_order);
    if ( max_fmg_iter > -1 )
      macproj.getMLMG().setMaxFmgIter(max_fmg_iter);

    //
    // Perform projection
    //
    macproj.project({mac_phi}, a_mac_tol, a_mac_abs_tol);

    if ( fluxes[0] )
      // fluxes = -B grad phi
      macproj.getFluxes({fluxes}, {mac_phi}, MLMG::Location::FaceCentroid);
}